

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  ostream *poVar1;
  string *psVar2;
  stringstream *psVar3;
  TestProperty *pTVar4;
  size_t sVar5;
  int i;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90;
  string *local_70;
  string *local_68;
  string local_60;
  stringstream *local_40;
  allocator<char> local_31;
  
  local_70 = indent;
  local_68 = __return_storage_ptr__;
  Message::Message((Message *)&local_98);
  local_40 = local_98.ptr_;
  if (0 < (int)((ulong)((long)(result->test_properties_).
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_properties_).
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    poVar1 = (ostream *)(local_98.ptr_ + 0x10);
    i = 0;
    do {
      pTVar4 = TestResult::GetTestProperty(result,i);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      __s = (pTVar4->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\": ",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,(pTVar4->value_)._M_dataplus._M_p,&local_31);
      EscapeJson(&local_60,&local_90);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(result->test_properties_).
                                     super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(result->test_properties_).
                                    super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  psVar3 = local_40;
  psVar2 = local_68;
  StringStreamToString(local_68,local_40);
  if (psVar3 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar3 + 8))(psVar3);
  }
  return psVar2;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n" << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}